

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::any_function
          (any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL> *this,
          any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL> *item)

{
  bool bVar1;
  pointer pTVar2;
  undefined8 in_RDI;
  unique_ptr<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  unique_ptr<dlib::any_function<void(dlib::vector<double,3l>const&),void,1ul>::Tbase<void(dlib::vector<double,3l>const&)>,std::default_delete<dlib::any_function<void(dlib::vector<double,3l>const&),void,1ul>::Tbase<void(dlib::vector<double,3l>const&)>>>
  ::
  unique_ptr<std::default_delete<dlib::any_function<void(dlib::vector<double,3l>const&),void,1ul>::Tbase<void(dlib::vector<double,3l>const&)>>,void>
            (in_stack_ffffffffffffffe0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
                      *)0x48e036);
  if (bVar1) {
    pTVar2 = std::
             unique_ptr<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
             ::operator->((unique_ptr<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
                           *)0x48e046);
    (**(code **)(*(long *)pTVar2 + 0x18))(pTVar2,in_RDI);
  }
  return;
}

Assistant:

any_function (
    const any_function& item
)
{
    if (item.data)
    {
        item.data->copy_to(data);
    }
}